

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solver.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
lu::solve(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,vector<double,_std::allocator<double>_> *b)

{
  int *piVar1;
  size_t __size;
  undefined4 uVar2;
  pointer pvVar3;
  pointer pdVar4;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  ulong __n;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  value_type_conflict1 *__ptr_02;
  void *pvVar8;
  size_t i_1;
  long lVar9;
  long lVar10;
  value_type_conflict1 *pvVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  size_t i_3;
  size_t i;
  ulong uVar20;
  int iVar21;
  value_type_conflict1 vVar22;
  double dVar23;
  double dVar24;
  
  pvVar3 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(A->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18;
  __size = __n * 8;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  __ptr_01 = malloc(__n * 4 + 4);
  __ptr_02 = (value_type_conflict1 *)malloc(__size);
  for (uVar20 = 0; __n != uVar20; uVar20 = uVar20 + 1) {
    pvVar8 = malloc(__size);
    *(void **)((long)__ptr + uVar20 * 8) = pvVar8;
  }
  pdVar4 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar20 = 0; uVar20 != __n; uVar20 = uVar20 + 1) {
    lVar12 = *(long *)&pvVar3[uVar20].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data;
    lVar10 = *(long *)((long)__ptr + uVar20 * 8);
    for (uVar14 = 0; __n != uVar14; uVar14 = uVar14 + 1) {
      *(undefined8 *)(lVar10 + uVar14 * 8) = *(undefined8 *)(lVar12 + uVar14 * 8);
    }
    *(double *)((long)__ptr_00 + uVar20 * 8) = pdVar4[uVar20];
  }
  iVar21 = (int)__n;
  lVar10 = (long)iVar21;
  lVar12 = -1;
  if (-1 < lVar10) {
    lVar12 = lVar10;
  }
  for (lVar9 = 0; lVar12 + 1 != lVar9; lVar9 = lVar9 + 1) {
    *(int *)((long)__ptr_01 + lVar9 * 4) = (int)lVar9;
  }
  lVar12 = 0;
  uVar20 = 0;
  if (0 < iVar21) {
    uVar20 = __n & 0xffffffff;
  }
  uVar14 = __n & 0xffffffff;
  lVar9 = 1;
  for (uVar16 = 0; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    dVar23 = 0.0;
    uVar13 = uVar16 & 0xffffffff;
    for (uVar19 = uVar16; uVar14 != uVar19; uVar19 = uVar19 + 1) {
      dVar24 = ABS(*(double *)(*(long *)((long)__ptr + uVar19 * 8) + uVar16 * 8));
      if (dVar23 < dVar24) {
        uVar13 = uVar19 & 0xffffffff;
        dVar23 = dVar24;
      }
    }
    if (dVar23 < 0.0) break;
    lVar18 = lVar9;
    if (uVar16 != uVar13) {
      uVar2 = *(undefined4 *)((long)__ptr_01 + uVar16 * 4);
      lVar17 = (long)(int)uVar13;
      *(undefined4 *)((long)__ptr_01 + uVar16 * 4) = *(undefined4 *)((long)__ptr_01 + lVar17 * 4);
      *(undefined4 *)((long)__ptr_01 + lVar17 * 4) = uVar2;
      uVar5 = *(undefined8 *)((long)__ptr + uVar16 * 8);
      *(undefined8 *)((long)__ptr + uVar16 * 8) = *(undefined8 *)((long)__ptr + lVar17 * 8);
      *(undefined8 *)((long)__ptr + lVar17 * 8) = uVar5;
      piVar1 = (int *)((long)__ptr_01 + lVar10 * 4);
      *piVar1 = *piVar1 + 1;
    }
    for (; (int)lVar18 < iVar21; lVar18 = lVar18 + 1) {
      lVar17 = *(long *)((long)__ptr + uVar16 * 8);
      lVar6 = *(long *)((long)__ptr + lVar18 * 8);
      *(double *)(lVar6 + uVar16 * 8) =
           *(double *)(lVar6 + uVar16 * 8) / *(double *)(lVar17 + uVar16 * 8);
      for (lVar15 = 1; (int)uVar16 + (int)lVar15 < iVar21; lVar15 = lVar15 + 1) {
        *(double *)(lVar6 + lVar12 + lVar15 * 8) =
             *(double *)(lVar6 + lVar12 + lVar15 * 8) -
             *(double *)(lVar6 + uVar16 * 8) * *(double *)(lVar17 + lVar12 + lVar15 * 8);
      }
    }
    lVar9 = lVar9 + 1;
    lVar12 = lVar12 + 8;
  }
  for (uVar16 = 0; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    vVar22 = *(value_type_conflict1 *)
              ((long)__ptr_00 + (long)*(int *)((long)__ptr_01 + uVar16 * 4) * 8);
    __ptr_02[uVar16] = vVar22;
    for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
      vVar22 = vVar22 - *(double *)(*(long *)((long)__ptr + uVar16 * 8) + uVar13 * 8) *
                        __ptr_02[uVar13];
      __ptr_02[uVar16] = vVar22;
    }
  }
  lVar12 = uVar14 * 8;
  pvVar11 = __ptr_02 + uVar14;
  while (iVar7 = (int)uVar14, 0 < iVar7) {
    uVar14 = uVar14 - 1;
    lVar10 = *(long *)((long)__ptr + uVar14 * 8);
    for (lVar9 = 0; iVar7 + (int)lVar9 < iVar21; lVar9 = lVar9 + 1) {
      __ptr_02[uVar14] =
           __ptr_02[uVar14] - *(double *)(lVar10 + lVar12 + lVar9 * 8) * pvVar11[lVar9];
    }
    __ptr_02[uVar14] = __ptr_02[uVar14] / *(double *)(lVar10 + uVar14 * 8);
    pvVar11 = pvVar11 + -1;
    lVar12 = lVar12 + -8;
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
  pvVar11 = __ptr_02;
  for (uVar20 = 0; __n != uVar20; uVar20 = uVar20 + 1) {
    free(*(void **)((long)__ptr + uVar20 * 8));
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,pvVar11);
    pvVar11 = pvVar11 + 1;
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> solve(const std::vector<std::vector<double>> &A, const std::vector<double> &b)
{
    size_t N = A.size();
    double **A_matr = static_cast<double **>(malloc(N * sizeof(double *)));
    double *b_vec = static_cast<double *>(malloc(N * sizeof(double)));
    int *P = static_cast<int *>(malloc((N + 1) * sizeof(int)));
    double *res = static_cast<double *>(malloc(N * sizeof(double)));

    for (size_t i = 0; i < N; ++i)
    {
        A_matr[i] = static_cast<double *>(malloc(N * sizeof(double)));
    }
    for (size_t i = 0; i < N; ++i)
    {
        for (size_t j = 0; j < N; ++j)
        {
            A_matr[i][j] = A[i][j];
        }
        b_vec[i] = b[i];
    }
    LUPDecompose(A_matr, N, 0, P);
    LUPSolve(A_matr, P, b_vec, N, res);
    std::vector<double> x;
    x.reserve(N);
    for (size_t i = 0; i < N; ++i)
    {
        free(A_matr[i]);
        x.push_back(res[i]);
    }
    free(A_matr);
    free(b_vec);
    free(P);
    free(res);
    return x;
}